

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool IsConfSupported(KeyInfo *key,string *error)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::operator==(&key->name,"conf");
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,
               "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files"
              );
  }
  else {
    bVar3 = std::operator==(&key->name,"reindex");
    if (bVar3) {
      logging_function._M_str = "IsConfSupported";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
      ;
      source_file._M_len = 0x61;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x56,ALL,Info,(ConstevalFormatString<0U>)0x1982a5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsConfSupported(KeyInfo& key, std::string& error) {
    if (key.name == "conf") {
        error = "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files";
        return false;
    }
    if (key.name == "reindex") {
        // reindex can be set in a config file but it is strongly discouraged as this will cause the node to reindex on
        // every restart. Allow the config but throw a warning
        LogPrintf("Warning: reindex=1 is set in the configuration file, which will significantly slow down startup. Consider removing or commenting out this option for better performance, unless there is currently a condition which makes rebuilding the indexes necessary\n");
        return true;
    }
    return true;
}